

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sglrReferenceContext.cpp
# Opt level: O2

void __thiscall
sglr::ReferenceContext::invalidateSubFramebuffer
          (ReferenceContext *this,deUint32 target,int numAttachments,deUint32 *attachments,int x,
          int y,int width,int height)

{
  deUint32 dVar1;
  deUint32 dVar2;
  deUint32 dVar3;
  deUint32 dVar4;
  Vec4 *color;
  ulong uVar5;
  int ndx;
  long lVar6;
  bool bVar7;
  bool bVar8;
  char local_c3 [3];
  ReferenceContext *local_c0;
  float local_b8;
  float local_b4;
  Vector<float,_4> local_b0;
  IVec4 area;
  MultisamplePixelBufferAccess access;
  Vec4 colorClearValue;
  MultisamplePixelBufferAccess buf;
  
  if (target == 0x8d40) {
    if (((numAttachments < 0) || (attachments == (deUint32 *)0x0 && 1 < (uint)numAttachments)) ||
       ((height | width) < 0)) {
      if (this->m_lastError == 0) {
        this->m_lastError = 0x501;
      }
    }
    else {
      local_b8 = (float)x;
      local_b4 = (float)y;
      tcu::Vector<float,_4>::Vector(&colorClearValue,0.0);
      local_c0 = this;
      bVar7 = this->m_drawFramebufferBinding != (Framebuffer *)0x0;
      dVar2 = 0x1800;
      if (bVar7) {
        dVar2 = 0x8ce0;
      }
      dVar3 = 0x1801;
      if (bVar7) {
        dVar3 = 0x8d00;
      }
      dVar4 = 0x1802;
      if (bVar7) {
        dVar4 = 0x8d20;
      }
      local_c3[2] = 0;
      local_c3[1] = 0;
      local_c3[0] = '\0';
      for (uVar5 = 0; (uint)numAttachments != uVar5; uVar5 = uVar5 + 1) {
        bVar7 = this->m_drawFramebufferBinding == (Framebuffer *)0x0;
        dVar1 = attachments[uVar5];
        bVar8 = dVar1 != 0x821a;
        if (((dVar1 != dVar2) && (dVar1 != dVar3)) && (dVar1 != dVar4 && (bVar8 || bVar7))) {
          if (this->m_lastError != 0) {
            return;
          }
          this->m_lastError = 0x501;
          return;
        }
        if (dVar1 == dVar2) {
          local_c3[0] = '\x01';
        }
        if (!bVar8 && !bVar7) {
          local_c3[1] = 1;
        }
        if (dVar1 == dVar3) {
          local_c3[1] = 1;
        }
        if (dVar1 == dVar4 || !bVar8 && !bVar7) {
          local_c3[2] = 1;
        }
      }
      for (lVar6 = 0; lVar6 != 3; lVar6 = lVar6 + 1) {
        if (local_c3[lVar6] == '\x01') {
          if (lVar6 == 0) {
            getDrawColorbuffer(&buf,local_c0);
          }
          else if (lVar6 == 1) {
            getDrawDepthbuffer(&access,local_c0);
            getDepthMultisampleAccess(&buf,&access);
          }
          else {
            getDrawStencilbuffer(&access,local_c0);
            getStencilMultisampleAccess(&buf,&access);
          }
          rr::MultisampleConstPixelBufferAccess::MultisampleConstPixelBufferAccess
                    ((MultisampleConstPixelBufferAccess *)&access,&buf);
          if (((access.m_access.super_ConstPixelBufferAccess.m_size.m_data[0] != 0) &&
              (access.m_access.super_ConstPixelBufferAccess.m_size.m_data[1] != 0)) &&
             (access.m_access.super_ConstPixelBufferAccess.m_size.m_data[2] != 0)) {
            access.m_access.super_ConstPixelBufferAccess.m_format.order = R;
            access.m_access.super_ConstPixelBufferAccess.m_format.type = SNORM_INT8;
            access.m_access.super_ConstPixelBufferAccess.m_size.m_data[0] =
                 buf.m_access.super_ConstPixelBufferAccess.m_size.m_data[1];
            access.m_access.super_ConstPixelBufferAccess.m_size.m_data[1] =
                 buf.m_access.super_ConstPixelBufferAccess.m_size.m_data[2];
            local_b0.m_data[0] = local_b8;
            local_b0.m_data[1] = local_b4;
            local_b0.m_data[2] = (float)width;
            local_b0.m_data[3] = (float)height;
            intersect((IVec4 *)&access,(IVec4 *)&local_b0);
            rr::getSubregion(&access,&buf,area.m_data[0],area.m_data[1],area.m_data[2],
                             area.m_data[3]);
            if (lVar6 == 0) {
              color = &colorClearValue;
            }
            else {
              if (lVar6 != 1) {
                tcu::Vector<int,_4>::Vector((Vector<int,_4> *)&local_b0,0);
                rr::clear(&access,(IVec4 *)&local_b0);
                goto LAB_0152d9c4;
              }
              tcu::Vector<float,_4>::Vector(&local_b0,1.0);
              color = &local_b0;
            }
            rr::clear(&access,color);
          }
        }
LAB_0152d9c4:
      }
    }
  }
  else if (this->m_lastError == 0) {
    this->m_lastError = 0x500;
  }
  return;
}

Assistant:

void ReferenceContext::invalidateSubFramebuffer (deUint32 target, int numAttachments, const deUint32* attachments, int x, int y, int width, int height)
{
	RC_IF_ERROR(target != GL_FRAMEBUFFER, GL_INVALID_ENUM, RC_RET_VOID);
	RC_IF_ERROR((numAttachments < 0) || (numAttachments > 1 && attachments == DE_NULL), GL_INVALID_VALUE, RC_RET_VOID);
	RC_IF_ERROR(width < 0 || height < 0, GL_INVALID_VALUE, RC_RET_VOID);

	// \todo [2012-07-17 pyry] Support multiple color attachments.

	const Vec4		colorClearValue		(0.0f);
	const float		depthClearValue		= 1.0f;
	const int		stencilClearValue	= 0;

	bool			isFboBound			= m_drawFramebufferBinding != DE_NULL;
	bool			discardBuffers[3]	= { false, false, false }; // Color, depth, stencil

	for (int attNdx = 0; attNdx < numAttachments; attNdx++)
	{
		bool	isColor			= attachments[attNdx] == (isFboBound ? GL_COLOR_ATTACHMENT0		: GL_COLOR);
		bool	isDepth			= attachments[attNdx] == (isFboBound ? GL_DEPTH_ATTACHMENT		: GL_DEPTH);
		bool	isStencil		= attachments[attNdx] == (isFboBound ? GL_STENCIL_ATTACHMENT	: GL_STENCIL);
		bool	isDepthStencil	= isFboBound && attachments[attNdx] == GL_DEPTH_STENCIL_ATTACHMENT;

		RC_IF_ERROR(!isColor && !isDepth && !isStencil && !isDepthStencil, GL_INVALID_VALUE, RC_RET_VOID);

		if (isColor)						discardBuffers[0] = true;
		if (isDepth || isDepthStencil)		discardBuffers[1] = true;
		if (isStencil || isDepthStencil)	discardBuffers[2] = true;
	}

	for (int ndx = 0; ndx < 3; ndx++)
	{
		if (!discardBuffers[ndx])
			continue;

		bool								isColor					= ndx == 0;
		bool								isDepth					= ndx == 1;
		bool								isStencil				= ndx == 2;
		rr::MultisamplePixelBufferAccess	buf						= isColor ? getDrawColorbuffer()								:
																	  isDepth ? getDepthMultisampleAccess(getDrawDepthbuffer())		:
																				getStencilMultisampleAccess(getDrawStencilbuffer());

		if (isEmpty(buf))
			continue;

		tcu::IVec4							area					= intersect(tcu::IVec4(0, 0, buf.raw().getHeight(), buf.raw().getDepth()), tcu::IVec4(x, y, width, height));
		rr::MultisamplePixelBufferAccess	access					= rr::getSubregion(buf, area.x(), area.y(), area.z(), area.w());

		if (isColor)
			rr::clear(access, colorClearValue);
		else if (isDepth)
			rr::clear(access, tcu::Vec4(depthClearValue));
		else if (isStencil)
			rr::clear(access, tcu::IVec4(stencilClearValue));
	}
}